

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O2

void general_hash_test(PCryptoHashType type,psize hash_len,pchar *msg1,pchar *msg2,puchar *etalon1,
                      puchar *etalon2,puchar *etalon3,pchar *hash1,pchar *hash2,pchar *hash3,
                      pchar *hash_stress)

{
  pchar *__s;
  PCryptoHashType PVar1;
  int iVar2;
  undefined8 uVar3;
  psize pVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  long lVar11;
  bool bVar12;
  undefined8 uStack_60;
  psize dig_len;
  pchar *local_50;
  long local_48;
  puchar *local_40;
  puchar *local_38;
  
  local_40 = etalon1;
  local_38 = etalon2;
  uVar3 = p_crypto_hash_new();
  pVar4 = p_crypto_hash_get_length(uVar3);
  if (pVar4 == hash_len) {
    PVar1 = p_crypto_hash_get_type(uVar3);
    if (PVar1 == type) {
      lVar5 = p_crypto_hash_get_string(uVar3);
      if (lVar5 == 0) {
        uStack_60 = 0x4f;
      }
      else {
        p_crypto_hash_reset(uVar3);
        p_free(lVar5);
        lVar5 = p_malloc0(hash_len);
        if (lVar5 == 0) {
          uStack_60 = 0x54;
        }
        else {
          local_48 = p_malloc0(10000);
          if (local_48 != 0) {
            cVar10 = 'a';
            uVar8 = 0;
            for (lVar11 = 0; lVar11 != 10000; lVar11 = lVar11 + 1) {
              *(char *)(local_48 + lVar11) = cVar10 + (char)((uVar8 & 0xffff) / 0x14) * -0x14;
              cVar10 = cVar10 + '\x01';
              uVar8 = uVar8 + 1;
            }
            sVar6 = strlen(msg1);
            p_crypto_hash_update(uVar3,msg1,sVar6);
            pcVar7 = (char *)p_crypto_hash_get_string(uVar3);
            iVar2 = strcmp(pcVar7,hash1);
            if (iVar2 != 0) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x61);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            local_50 = msg2;
            p_free(pcVar7);
            p_crypto_hash_reset(uVar3);
            dig_len = hash_len;
            sVar6 = strlen(msg1);
            p_crypto_hash_update(uVar3,msg1,sVar6);
            p_crypto_hash_get_digest(uVar3,lVar5,&dig_len);
            if (dig_len != hash_len) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x6b);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < hash_len; uVar8 = uVar8 + 1) {
              if (*(puchar *)(lVar5 + uVar9) != local_40[uVar9]) {
                printf("%s:%d: check failed\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                       ,0x6e);
                p_atomic_int_inc(&p_test_module_fail_counter);
              }
            }
            p_crypto_hash_reset(uVar3);
            __s = local_50;
            sVar6 = strlen(local_50);
            p_crypto_hash_update(uVar3,__s,sVar6);
            pcVar7 = (char *)p_crypto_hash_get_string(uVar3);
            iVar2 = strcmp(pcVar7,hash2);
            if (iVar2 != 0) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x77);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            p_free(pcVar7);
            p_crypto_hash_reset(uVar3);
            dig_len = hash_len;
            sVar6 = strlen(__s);
            p_crypto_hash_update(uVar3,__s,sVar6);
            p_crypto_hash_get_digest(uVar3,lVar5,&dig_len);
            if (dig_len != hash_len) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x81);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < hash_len; uVar8 = uVar8 + 1) {
              if (*(puchar *)(lVar5 + uVar9) != local_38[uVar9]) {
                printf("%s:%d: check failed\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                       ,0x84);
                p_atomic_int_inc(&p_test_module_fail_counter);
              }
            }
            p_crypto_hash_reset(uVar3);
            iVar2 = 1000000;
            while (bVar12 = iVar2 != 0, iVar2 = iVar2 + -1, bVar12) {
              p_crypto_hash_update(uVar3,"a",1);
            }
            pcVar7 = (char *)p_crypto_hash_get_string(uVar3);
            iVar2 = strcmp(pcVar7,hash3);
            if (iVar2 != 0) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x90);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            p_free(pcVar7);
            p_crypto_hash_reset(uVar3);
            iVar2 = 1000000;
            dig_len = hash_len;
            while (bVar12 = iVar2 != 0, iVar2 = iVar2 + -1, bVar12) {
              p_crypto_hash_update(uVar3,"a",1);
            }
            p_crypto_hash_get_digest(uVar3,lVar5,&dig_len);
            if (dig_len != hash_len) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0x9b);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < hash_len; uVar8 = uVar8 + 1) {
              if (*(puchar *)(lVar5 + uVar9) != etalon3[uVar9]) {
                printf("%s:%d: check failed\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                       ,0x9e);
                p_atomic_int_inc(&p_test_module_fail_counter);
              }
            }
            p_crypto_hash_reset(uVar3);
            lVar11 = local_48;
            p_crypto_hash_update(uVar3,local_48,10000);
            pcVar7 = (char *)p_crypto_hash_get_string(uVar3);
            iVar2 = strcmp(pcVar7,hash_stress);
            if (iVar2 != 0) {
              printf("%s:%d: check failed\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
                     ,0xa6);
              p_atomic_int_inc(&p_test_module_fail_counter);
            }
            p_free(pcVar7);
            p_crypto_hash_reset(uVar3);
            p_free(lVar11);
            p_free(lVar5);
            p_crypto_hash_free(uVar3);
            return;
          }
          uStack_60 = 0x57;
        }
      }
    }
    else {
      uStack_60 = 0x4c;
    }
  }
  else {
    uStack_60 = 0x4b;
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
         ,uStack_60);
  exit(-1);
}

Assistant:

static void
general_hash_test (PCryptoHashType	type,
		   psize		hash_len,
		   const pchar		*msg1,
		   const pchar		*msg2,
		   const puchar		*etalon1,
		   const puchar		*etalon2,
		   const puchar		*etalon3,
		   const pchar		*hash1,
		   const pchar		*hash2,
		   const pchar		*hash3,
		   const pchar		*hash_stress)
{
	PCryptoHash	*crypto_hash;
	psize		dig_len;
	pchar		*hash_str;
	pchar		*long_str;
	puchar		*hash_dig;

	crypto_hash = p_crypto_hash_new (type);

	P_TEST_REQUIRE ((psize) p_crypto_hash_get_length (crypto_hash) == hash_len);
	P_TEST_REQUIRE (p_crypto_hash_get_type (crypto_hash) == type);

	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_REQUIRE (hash_str != NULL);
	p_crypto_hash_reset (crypto_hash);
	p_free (hash_str);

	hash_dig = (puchar *) p_malloc0 (hash_len);
	P_TEST_REQUIRE (hash_dig != NULL);

	long_str = (pchar *) p_malloc0 (PCRYPTO_STRESS_LENGTH);
	P_TEST_REQUIRE (long_str != NULL);

	for (int i = 0; i < PCRYPTO_STRESS_LENGTH; ++i)
		long_str[i] = (pchar) (97 + i % 20);

	/* Case 1 */

	/* Check string */
	p_crypto_hash_update (crypto_hash, (const puchar *) msg1, strlen (msg1));
	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_CHECK (strcmp (hash_str, hash1) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	p_crypto_hash_update (crypto_hash, (const puchar *) msg1, strlen (msg1));
	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);

	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon1[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Case 2 */

	/* Check string */
	p_crypto_hash_update (crypto_hash, (const puchar *) msg2, strlen (msg2));
	hash_str = p_crypto_hash_get_string (crypto_hash);
	P_TEST_CHECK (strcmp (hash_str, hash2) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	p_crypto_hash_update (crypto_hash, (const puchar *) msg2, strlen (msg2));
	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);

	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon2[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Case 3 */

	/* Check string */
	for (int i = 0; i < PCRYPTO_MAX_UPDATES; ++i)
		p_crypto_hash_update (crypto_hash, (const puchar *) "a", 1);

	hash_str = p_crypto_hash_get_string (crypto_hash);

	P_TEST_CHECK (strcmp (hash_str, hash3) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	/* Check digest */
	dig_len = hash_len;
	for (int i = 0; i < PCRYPTO_MAX_UPDATES; ++i)
		p_crypto_hash_update (crypto_hash, (const puchar *) "a", 1);

	p_crypto_hash_get_digest (crypto_hash, hash_dig, &dig_len);
	P_TEST_CHECK (dig_len == hash_len);

	for (unsigned int i = 0; i < hash_len; ++i)
		P_TEST_CHECK (hash_dig[i] == etalon3[i]);

	p_crypto_hash_reset (crypto_hash);

	/* Stress test */
	p_crypto_hash_update (crypto_hash, (const puchar *) long_str, PCRYPTO_STRESS_LENGTH);
	hash_str = p_crypto_hash_get_string (crypto_hash);

	P_TEST_CHECK (strcmp (hash_str, hash_stress) == 0);
	p_free (hash_str);

	p_crypto_hash_reset (crypto_hash);

	p_free (long_str);
	p_free (hash_dig);
	p_crypto_hash_free (crypto_hash);
}